

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests_source.cpp
# Opt level: O3

void InvalidParameter(void)

{
  printf((char *)0x0);
  return;
}

Assistant:

void InvalidParameter() {
    char* formatString;
    // Call printf_s with invalid parameters.
    formatString = NULL;
#pragma warning(disable : 6387)   // warning C6387: 'argument 1' might be '0': this does not adhere to the specification for the function 'printf'
    printf(formatString);
#pragma warning(default : 6387)  
}